

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O1

bool __thiscall Cache::cacheSetFull(Cache *this,uint32_t set_id)

{
  uint32_t uVar1;
  bool *pbVar2;
  ulong uVar3;
  uint uVar4;
  pointer pBVar5;
  uint uVar6;
  bool bVar7;
  
  uVar1 = (this->policy).associativity;
  uVar6 = set_id * uVar1;
  uVar4 = uVar1 + uVar6;
  bVar7 = uVar4 <= uVar6;
  if (!bVar7) {
    pBVar5 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (ulong)uVar6;
    if (pBVar5[uVar3].valid == true) {
      pBVar5 = pBVar5 + uVar3 + 1;
      do {
        uVar3 = uVar3 + 1;
        if (uVar4 == uVar3) break;
        pbVar2 = &pBVar5->valid;
        pBVar5 = pBVar5 + 1;
      } while (*pbVar2 != false);
      bVar7 = uVar4 <= uVar3;
    }
  }
  return bVar7;
}

Assistant:

bool Cache::cacheSetFull(uint32_t set_id) const {
    uint32_t begin = set_id * this->policy.associativity;
    uint32_t end = begin + this->policy.associativity;
    for (uint32_t i = begin; i < end; i++) {
        if (!this->blocks[i].valid)
            return false;
    }
    return true;
}